

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

Type * slang::ast::Type::fromSyntax
                 (Compilation *compilation,DataTypeSyntax *node,ASTContext *context,
                 Type *typedefTarget)

{
  SyntaxNode *this;
  bool bVar1;
  int iVar2;
  Type *pTVar3;
  SourceLocation location;
  Diagnostic *this_00;
  undefined4 extraout_var;
  SyntaxKind typeKind;
  string_view arg;
  SourceRange SVar4;
  span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL> dimensions;
  ASTContext *in_stack_00000008;
  Expression *this_01;
  
  typeKind = (node->super_ExpressionSyntax).super_SyntaxNode.kind;
  if (typeKind - RealTimeType < 2) goto LAB_0022906a;
  if (typeKind == BitType) {
LAB_002290e2:
    pTVar3 = IntegralType::fromSyntax(compilation,(IntegerTypeSyntax *)node,context);
    return pTVar3;
  }
  if (typeKind != ByteType) {
    if (typeKind == CHandleType) goto LAB_0022906a;
    if (typeKind == EnumType) {
      pTVar3 = EnumType::findDefinition(compilation,(EnumTypeSyntax *)node,context);
      return pTVar3;
    }
    if (typeKind == EventType) goto LAB_0022906a;
    if (typeKind == ImplicitType) {
      dimensions._M_extent._M_extent_value._0_1_ =
           (short)node[1].super_ExpressionSyntax.super_SyntaxNode.kind ==
           LogicalEquivalenceExpression;
      dimensions._M_ptr = (pointer)node[3].super_ExpressionSyntax.super_SyntaxNode.previewNode;
      dimensions._M_extent._M_extent_value._1_7_ = 0;
      pTVar3 = IntegralType::fromSyntax
                         ((IntegralType *)compilation,(Compilation *)0x114,
                          (SyntaxKind)node[3].super_ExpressionSyntax.super_SyntaxNode.parent,
                          dimensions,SUB81(context,0),in_stack_00000008);
      return pTVar3;
    }
    if ((typeKind != IntType) && (typeKind != IntegerType)) {
      if (typeKind == LogicType) goto LAB_002290e2;
      if (typeKind != LongIntType) {
        if (typeKind == NamedType) {
          pTVar3 = lookupNamedType(compilation,
                                   *(NameSyntax **)&node[1].super_ExpressionSyntax.super_SyntaxNode,
                                   context,typedefTarget != (Type *)0x0);
          return pTVar3;
        }
        if (((typeKind == PropertyType) || (typeKind == VoidType)) || (typeKind == SequenceType))
        goto LAB_0022906a;
        if (typeKind != ShortIntType) {
          if ((typeKind == ShortRealType) || (typeKind == StringType)) goto LAB_0022906a;
          if (typeKind == StructType) {
            if (node[2].super_ExpressionSyntax.super_SyntaxNode.previewNode == (SyntaxNode *)0x0) {
              pTVar3 = UnpackedStructType::fromSyntax(context,(StructUnionTypeSyntax *)node);
              return pTVar3;
            }
            pTVar3 = PackedStructType::fromSyntax(compilation,(StructUnionTypeSyntax *)node,context)
            ;
            return pTVar3;
          }
          if (typeKind != TimeType) {
            if (typeKind == TypeReference) {
              this = node[2].super_ExpressionSyntax.super_SyntaxNode.parent;
              iVar2 = Expression::bind((int)this,(sockaddr *)context,4);
              this_01 = (Expression *)CONCAT44(extraout_var,iVar2);
              bVar1 = Expression::bad(this_01);
              if (!bVar1) {
                bVar1 = Expression::hasHierarchicalReference(this_01);
                if ((bVar1) && (((compilation->options).flags.m_bits & 1) == 0)) {
                  SVar4 = slang::syntax::SyntaxNode::sourceRange(this);
                  ASTContext::addDiag(context,(DiagCode)0x200009,SVar4);
                }
                bVar1 = isVoid((this_01->type).ptr);
                if (bVar1) {
                  SVar4 = slang::syntax::SyntaxNode::sourceRange(this);
                  ASTContext::addDiag(context,(DiagCode)0x210009,SVar4);
                }
              }
              return (this_01->type).ptr;
            }
            if (typeKind == UnionType) {
              if ((node[2].super_ExpressionSyntax.super_SyntaxNode.previewNode == (SyntaxNode *)0x0)
                 && (*(short *)&node[1].super_ExpressionSyntax.super_SyntaxNode.previewNode != 0x118
                    )) {
                pTVar3 = UnpackedUnionType::fromSyntax(context,(StructUnionTypeSyntax *)node);
                return pTVar3;
              }
              pTVar3 = PackedUnionType::fromSyntax
                                 (compilation,(StructUnionTypeSyntax *)node,context);
              return pTVar3;
            }
            if (typeKind != Untyped) {
              if (typeKind == VirtualInterfaceType) {
                pTVar3 = VirtualInterfaceType::fromSyntax
                                   (context,(VirtualInterfaceTypeSyntax *)node);
                return pTVar3;
              }
              goto LAB_002290e2;
            }
            goto LAB_0022906a;
          }
        }
      }
    }
  }
  if (node[4].super_ExpressionSyntax.super_SyntaxNode.parent != (SyntaxNode *)0x0) {
    location = parsing::Token::location
                         ((Token *)(**(long **)&node[4].super_ExpressionSyntax.super_SyntaxNode +
                                   0x18));
    this_00 = ASTContext::addDiag(context,(DiagCode)0x1a0009,location);
    arg = parsing::LexerFacts::getTokenKindText
                    ((TokenKind)node[1].super_ExpressionSyntax.super_SyntaxNode.kind);
    Diagnostic::operator<<(this_00,arg);
  }
  if (*(long *)&node[2].super_ExpressionSyntax.super_SyntaxNode != 0) {
    pTVar3 = getPredefinedType(compilation,(node->super_ExpressionSyntax).super_SyntaxNode.kind,
                               *(short *)&node[1].super_ExpressionSyntax.super_SyntaxNode.
                                          previewNode == 0x116);
    return pTVar3;
  }
  typeKind = (node->super_ExpressionSyntax).super_SyntaxNode.kind;
LAB_0022906a:
  pTVar3 = Compilation::getType(compilation,typeKind);
  return pTVar3;
}

Assistant:

const Type& Type::fromSyntax(Compilation& compilation, const DataTypeSyntax& node,
                             const ASTContext& context, const Type* typedefTarget) {
    switch (node.kind) {
        case SyntaxKind::BitType:
        case SyntaxKind::LogicType:
        case SyntaxKind::RegType:
            return IntegralType::fromSyntax(compilation, node.as<IntegerTypeSyntax>(), context);
        case SyntaxKind::ByteType:
        case SyntaxKind::ShortIntType:
        case SyntaxKind::IntType:
        case SyntaxKind::LongIntType:
        case SyntaxKind::IntegerType:
        case SyntaxKind::TimeType: {
            auto& its = node.as<IntegerTypeSyntax>();
            if (!its.dimensions.empty()) {
                // Error but don't fail out; just remove the dims and keep trucking
                auto& diag = context.addDiag(diag::PackedDimsOnPredefinedType,
                                             its.dimensions[0]->openBracket.location());
                diag << LexerFacts::getTokenKindText(its.keyword.kind);
            }

            if (!its.signing)
                return compilation.getType(node.kind);

            return getPredefinedType(compilation, node.kind,
                                     its.signing.kind == TokenKind::SignedKeyword);
        }
        case SyntaxKind::RealType:
        case SyntaxKind::RealTimeType:
        case SyntaxKind::ShortRealType:
        case SyntaxKind::StringType:
        case SyntaxKind::CHandleType:
        case SyntaxKind::EventType:
        case SyntaxKind::VoidType:
        case SyntaxKind::Untyped:
        case SyntaxKind::PropertyType:
        case SyntaxKind::SequenceType:
            return compilation.getType(node.kind);
        case SyntaxKind::EnumType:
            return EnumType::findDefinition(compilation, node.as<EnumTypeSyntax>(), context);
        case SyntaxKind::StructType: {
            const auto& structUnion = node.as<StructUnionTypeSyntax>();
            return structUnion.packed
                       ? PackedStructType::fromSyntax(compilation, structUnion, context)
                       : UnpackedStructType::fromSyntax(context, structUnion);
        }
        case SyntaxKind::UnionType: {
            const auto& structUnion = node.as<StructUnionTypeSyntax>();
            return (structUnion.packed || structUnion.taggedOrSoft.kind == TokenKind::SoftKeyword)
                       ? PackedUnionType::fromSyntax(compilation, structUnion, context)
                       : UnpackedUnionType::fromSyntax(context, structUnion);
        }
        case SyntaxKind::NamedType:
            return lookupNamedType(compilation, *node.as<NamedTypeSyntax>().name, context,
                                   typedefTarget != nullptr);
        case SyntaxKind::ImplicitType: {
            auto& implicit = node.as<ImplicitTypeSyntax>();
            return IntegralType::fromSyntax(compilation, SyntaxKind::LogicType, implicit.dimensions,
                                            implicit.signing.kind == TokenKind::SignedKeyword,
                                            context);
        }
        case SyntaxKind::TypeReference: {
            auto& exprSyntax = *node.as<TypeReferenceSyntax>().expr;
            auto& expr = Expression::bind(exprSyntax, context,
                                          ASTFlags::AllowDataType | ASTFlags::TypeOperator);

            if (!expr.bad()) {
                if (expr.hasHierarchicalReference() &&
                    !compilation.hasFlag(CompilationFlags::AllowHierarchicalConst)) {
                    context.addDiag(diag::TypeRefHierarchical, exprSyntax.sourceRange());
                }

                if (expr.type->isVoid())
                    context.addDiag(diag::TypeRefVoid, exprSyntax.sourceRange());
            }

            return *expr.type;
        }
        case SyntaxKind::VirtualInterfaceType:
            return VirtualInterfaceType::fromSyntax(context, node.as<VirtualInterfaceTypeSyntax>());
        default:
            SLANG_UNREACHABLE;
    }
}